

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>::templated_iterator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
::emplace_new_key<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>const&>
          (sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *key)

{
  long lVar1;
  char cVar2;
  long lVar3;
  type_info *ptVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  type_index tVar7;
  EntryPointer psVar8;
  EntryPointer psVar9;
  EntryPointer psVar10;
  char __tmp_1;
  sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
  sVar11;
  long lVar12;
  element_type *peVar13;
  undefined8 unaff_RBP;
  undefined7 uVar15;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  size_t sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>::templated_iterator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_bool>
  pVar20;
  pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> local_38;
  
  lVar3 = *(long *)(this + 8);
  if ((lVar3 != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
       )distance_from_desired)) {
    lVar12 = *(long *)(this + 0x18) + 1;
    auVar18._8_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar18._0_8_ = lVar12;
    auVar18._12_4_ = 0x45300000;
    lVar1 = lVar3 + 1;
    auVar19._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar19._0_8_ = lVar1;
    auVar19._12_4_ = 0x45300000;
    if ((auVar18._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar19._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      uVar15 = (undefined7)((ulong)unaff_RBP >> 8);
      if (current_entry->distance_from_desired < '\0') {
        (current_entry->field_1).value.first._M_target = (key->first)._M_target;
        (current_entry->field_1).value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (key->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        p_Var6 = (key->second).
                 super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        (current_entry->field_1).value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var6;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar14 = CONCAT71(uVar15,1);
      }
      else {
        ptVar4 = (key->first)._M_target;
        peVar5 = (key->second).
                 super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (key->second).
                 super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        cVar2 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        tVar7._M_target = (current_entry->field_1).value.first._M_target;
        (current_entry->field_1).value.first._M_target = ptVar4;
        peVar13 = (current_entry->field_1).value.second.
                  super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (current_entry->field_1).value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
        p_Var16 = (current_entry->field_1).value.second.
                  super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (current_entry->field_1).value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var6;
        sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
                  )(cVar2 + '\x01');
        cVar2 = current_entry[1].distance_from_desired;
        psVar10 = current_entry + 1;
        psVar9 = current_entry;
        while (psVar8 = psVar10, local_38.first._M_target = tVar7._M_target, -1 < cVar2) {
          if (cVar2 < (char)sVar11) {
            psVar8->distance_from_desired = (int8_t)sVar11;
            local_38.first._M_target = (psVar8->field_1).value.first._M_target;
            (psVar8->field_1).value.first._M_target = tVar7._M_target;
            peVar5 = (psVar8->field_1).value.second.
                     super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var6 = (psVar8->field_1).value.second.
                     super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (psVar8->field_1).value.second.
            super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13
            ;
            (psVar8->field_1).value.second.
            super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Var16;
            sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
                      )(cVar2 + '\x01');
            peVar13 = peVar5;
            p_Var16 = p_Var6;
          }
          else {
            sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>>>
                      )((char)sVar11 + '\x01');
            if (sVar11 == this[0x11]) {
              local_38.first._M_target = (current_entry->field_1).value.first._M_target;
              (current_entry->field_1).value.first._M_target = tVar7._M_target;
              local_38.second.
              super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (current_entry->field_1).value.second.
                   super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (current_entry->field_1).value.second.
              super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar13;
              local_38.second.
              super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (current_entry->field_1).value.second.
                      super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
              (current_entry->field_1).value.second.
              super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = p_Var16;
              uVar14 = *(long *)(this + 8) * 2 + 2;
              sVar17 = 4;
              if (4 < uVar14) {
                sVar17 = uVar14;
              }
              sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>
              ::rehash((sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>
                        *)this,sVar17);
              pVar20 = emplace<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>>
                                 (this,&local_38);
              current_entry = (EntryPointer)pVar20.first.current;
              uVar14 = (ulong)pVar20._8_4_;
              goto LAB_0015560e;
            }
          }
          tVar7._M_target = local_38.first._M_target;
          psVar10 = psVar8 + 1;
          psVar9 = psVar8;
          cVar2 = psVar8[1].distance_from_desired;
        }
        psVar9[1].field_1.value.first._M_target = tVar7._M_target;
        psVar9[1].field_1.value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
        psVar9[1].field_1.value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_38.second.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        psVar9[1].field_1.value.second.
        super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var16;
        local_38.second.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        psVar8->distance_from_desired = (int8_t)sVar11;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar14 = CONCAT71(uVar15,1);
LAB_0015560e:
        if (local_38.second.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_38.second.
                     super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      goto LAB_00155448;
    }
  }
  uVar14 = lVar3 * 2 + 2;
  sVar17 = 4;
  if (4 < uVar14) {
    sVar17 = uVar14;
  }
  sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>
  ::rehash((sherwood_v3_table<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>_>
            *)this,sVar17);
  pVar20 = emplace<std::pair<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>const&>
                     (this,key);
  current_entry = (EntryPointer)pVar20.first.current;
  uVar14 = (ulong)pVar20._8_4_;
LAB_00155448:
  pVar20._8_8_ = uVar14 & 0xffffffff;
  pVar20.first.current = current_entry;
  return pVar20;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }